

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::capsule::capsule(capsule *this,object *o)

{
  PyObject *pPVar1;
  undefined1 auVar2 [16];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (this->super_object).super_handle.m_ptr = (o->super_handle).m_ptr;
  (o->super_handle).m_ptr = (PyObject *)0x0;
  pPVar1 = (this->super_object).super_handle.m_ptr;
  if ((pPVar1 != (PyObject *)0x0) && (pPVar1->ob_type != (PyTypeObject *)&PyCapsule_Type)) {
    auVar2 = __cxa_allocate_exception(0x10);
    detail::get_fully_qualified_tp_name_abi_cxx11_
              (&local_80,(detail *)((this->super_object).super_handle.m_ptr)->ob_type,auVar2._8_8_);
    std::operator+(&local_60,"Object of type \'",&local_80);
    std::operator+(&local_40,&local_60,"\' is not an instance of \'capsule\'");
    type_error::runtime_error(auVar2._0_8_,&local_40);
    __cxa_throw(auVar2._0_8_,&type_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

object(object &&other) noexcept : handle(other) { other.m_ptr = nullptr; }